

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::readObject(Reader *this,Token *param_1)

{
  bool bVar1;
  _Elt_pointer ppVVar2;
  allocator<char> local_b9;
  ValueHolder local_b8 [4];
  Token comma;
  Token colon;
  string name;
  Token tokenName;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  Value::Value((Value *)local_b8,objectValue);
  ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar2 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::operator=(ppVVar2[-1],(Value *)local_b8);
  Value::~Value((Value *)local_b8);
  do {
    readToken(this,&tokenName);
    while (tokenName.type_ == tokenComment) {
      readToken(this,&tokenName);
    }
    if (tokenName.type_ == tokenObjectEnd) {
      if (name._M_string_length != 0) {
LAB_001b8ce5:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8[0].bool_,"Missing \'}\' or object member name",
                   (allocator<char> *)&colon);
        addErrorAndRecover(this,(string *)local_b8,&tokenName,tokenObjectEnd);
LAB_001b8d13:
        std::__cxx11::string::~string((string *)&local_b8[0].bool_);
LAB_001b8d1d:
        bVar1 = false;
        goto LAB_001b8d23;
      }
      break;
    }
    if (tokenName.type_ != tokenString) goto LAB_001b8ce5;
    std::__cxx11::string::assign((char *)&name);
    bVar1 = decodeString(this,&tokenName,&name);
    if (!bVar1) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_001b8d1d;
    }
    readToken(this,&colon);
    if (colon.type_ != tokenMemberSeparator) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8[0].bool_,"Missing \':\' after object member name",
                 (allocator<char> *)&comma);
      addErrorAndRecover(this,(string *)local_b8,&colon,tokenObjectEnd);
      goto LAB_001b8d13;
    }
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_b8[0].map_ = (ObjectValues *)Value::operator[](ppVVar2[-1],&name);
    std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_b8[0].map_)
    ;
    bVar1 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar1) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_001b8d1d;
    }
    readToken(this,&comma);
    if ((tokenComment < comma.type_) || ((0x1404U >> (comma.type_ & 0x1f) & 1) == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8[0].bool_,"Missing \',\' or \'}\' in object declaration",
                 &local_b9);
      addErrorAndRecover(this,(string *)local_b8,&comma,tokenObjectEnd);
      goto LAB_001b8d13;
    }
    while (comma.type_ == tokenComment) {
      readToken(this,&comma);
    }
  } while (comma.type_ != tokenObjectEnd);
  bVar1 = true;
LAB_001b8d23:
  std::__cxx11::string::~string((string *)&name);
  return bVar1;
}

Assistant:

bool 
Reader::readObject( Token &/*tokenStart*/ )
{
   Token tokenName;
   std::string name;
   currentValue() = Value( objectValue );
   while ( readToken( tokenName ) )
   {
      bool initialTokenOk = true;
      while ( tokenName.type_ == tokenComment  &&  initialTokenOk )
         initialTokenOk = readToken( tokenName );
      if  ( !initialTokenOk )
         break;
      if ( tokenName.type_ == tokenObjectEnd  &&  name.empty() )  // empty object
         return true;
      if ( tokenName.type_ != tokenString )
         break;
      
      name = "";
      if ( !decodeString( tokenName, name ) )
         return recoverFromError( tokenObjectEnd );

      Token colon;
      if ( !readToken( colon ) ||  colon.type_ != tokenMemberSeparator )
      {
         return addErrorAndRecover( "Missing ':' after object member name", 
                                    colon, 
                                    tokenObjectEnd );
      }
      Value &value = currentValue()[ name ];
      nodes_.push( &value );
      bool ok = readValue();
      nodes_.pop();
      if ( !ok ) // error already set
         return recoverFromError( tokenObjectEnd );

      Token comma;
      if ( !readToken( comma )
            ||  ( comma.type_ != tokenObjectEnd  &&  
                  comma.type_ != tokenArraySeparator &&
                  comma.type_ != tokenComment ) )
      {
         return addErrorAndRecover( "Missing ',' or '}' in object declaration", 
                                    comma, 
                                    tokenObjectEnd );
      }
      bool finalizeTokenOk = true;
      while ( comma.type_ == tokenComment &&
              finalizeTokenOk )
         finalizeTokenOk = readToken( comma );
      if ( comma.type_ == tokenObjectEnd )
         return true;
   }
   return addErrorAndRecover( "Missing '}' or object member name", 
                              tokenName, 
                              tokenObjectEnd );
}